

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callgrind_converter.cpp
# Opt level: O3

void __thiscall HawkTracer::client::CallgrindConverter::stop(CallgrindConverter *this)

{
  char *pcVar1;
  unique_ptr<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
  *puVar2;
  uint __val;
  pointer pcVar3;
  bool bVar4;
  pointer ppVar5;
  char cVar6;
  char cVar7;
  undefined8 *puVar8;
  ostream *poVar9;
  uint uVar10;
  _Alloc_hider _Var11;
  pointer pcVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  pointer ppVar13;
  _Hash_node_base *p_Var14;
  string thread_file_name;
  string __str_1;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  root_calls;
  CallGraph _call_graph;
  ofstream thread_output_file;
  char *local_2d8;
  long local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  CallgrindConverter *local_2b8;
  pointer *local_2b0;
  uint local_2a8;
  undefined4 uStack_2a4;
  pointer local_2a0 [2];
  shared_ptr<HawkTracer::client::CallGraph::TreeNode> local_290;
  undefined8 local_280;
  _func_int **local_278;
  vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  local_270;
  CallGraph local_258;
  undefined1 local_230 [8];
  unique_ptr<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
  local_228;
  _Alloc_hider local_220 [29];
  ios_base local_138 [264];
  
  p_Var14 = (this->_events)._M_h._M_before_begin._M_nxt;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    local_278 = _VTT;
    local_280 = _memcpy;
    local_2b8 = this;
    do {
      local_258._root_calls.
      super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_258._current_call.
      super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_258._root_calls.
      super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_258._root_calls.
      super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258._current_call.
      super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      CallGraph::make(&local_270,&local_258,
                      (vector<HawkTracer::client::CallGraph::NodeData,_std::allocator<HawkTracer::client::CallGraph::NodeData>_>
                       *)(p_Var14 + 2));
      local_230 = (undefined1  [8])local_220;
      pcVar3 = (local_2b8->_file_name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_230,pcVar3,pcVar3 + (local_2b8->_file_name)._M_string_length);
      std::__cxx11::string::append((char *)local_230);
      __val = *(uint *)&p_Var14[1]._M_nxt;
      cVar7 = '\x01';
      if (9 < __val) {
        uVar10 = __val;
        cVar6 = '\x04';
        do {
          cVar7 = cVar6;
          if (uVar10 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_0010de03;
          }
          if (uVar10 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_0010de03;
          }
          if (uVar10 < 10000) goto LAB_0010de03;
          bVar4 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar6 = cVar7 + '\x04';
        } while (bVar4);
        cVar7 = cVar7 + '\x01';
      }
LAB_0010de03:
      local_2b0 = local_2a0;
      std::__cxx11::string::_M_construct((ulong)&local_2b0,cVar7);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2b0,local_2a8,__val);
      _Var11._M_p = (pointer)0xf;
      if (local_230 != (undefined1  [8])local_220) {
        _Var11._M_p = local_220[0]._M_p;
      }
      pcVar3 = (pointer)(CONCAT44(uStack_2a4,local_2a8) +
                        (long)local_228._M_t.
                              super___uniq_ptr_impl<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_HawkTracer::client::TracepointMap_*,_std::default_delete<HawkTracer::client::TracepointMap>_>
                              .super__Head_base<0UL,_HawkTracer::client::TracepointMap_*,_false>.
                              _M_head_impl);
      if (_Var11._M_p < pcVar3) {
        pcVar12 = (pointer)0xf;
        if (local_2b0 != local_2a0) {
          pcVar12 = local_2a0[0];
        }
        if (pcVar12 < pcVar3) goto LAB_0010de78;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_230);
      }
      else {
LAB_0010de78:
        puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_230,(ulong)local_2b0);
      }
      local_2d8 = (char *)&local_2c8;
      pcVar1 = (char *)(puVar8 + 2);
      if ((char *)*puVar8 == pcVar1) {
        local_2c8 = *(undefined8 *)pcVar1;
        uStack_2c0 = puVar8[3];
      }
      else {
        local_2c8 = *(undefined8 *)pcVar1;
        local_2d8 = (char *)*puVar8;
      }
      local_2d0 = puVar8[1];
      *puVar8 = pcVar1;
      puVar8[1] = 0;
      *pcVar1 = '\0';
      if (local_2b0 != local_2a0) {
        operator_delete(local_2b0);
      }
      if (local_230 != (undefined1  [8])local_220) {
        operator_delete((void *)local_230);
      }
      std::ofstream::ofstream((CallgrindConverter *)local_230,(string *)&local_2d8,_S_out);
      cVar7 = std::__basic_file<char>::is_open();
      if (cVar7 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Can\'t open file: ",0x11);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_2d8,local_2d0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      else {
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,(local_2b8->_callgrind_header)._M_dataplus._M_p,
                            (local_2b8->_callgrind_header)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"thread: ",8);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_230,"events: Duration",0x10);
        this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"\n",1);
        ppVar5 = local_270.
                 super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar13 = local_270.
                       super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar5;
            ppVar13 = ppVar13 + 1) {
          local_290.
          super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (ppVar13->first).
                   super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          local_290.
          super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (ppVar13->first).
               super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if ((CallgrindConverter *)
              local_290.
              super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (CallgrindConverter *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              puVar2 = &(((CallgrindConverter *)
                         local_290.
                         super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->super_Converter)._tracepoint_map;
              *(int *)&(puVar2->_M_t).
                       super___uniq_ptr_impl<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HawkTracer::client::TracepointMap_*,_std::default_delete<HawkTracer::client::TracepointMap>_>
                       .super__Head_base<0UL,_HawkTracer::client::TracepointMap_*,_false>.
                       _M_head_impl =
                   *(int *)&(puVar2->_M_t).
                            super___uniq_ptr_impl<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HawkTracer::client::TracepointMap_*,_std::default_delete<HawkTracer::client::TracepointMap>_>
                            .super__Head_base<0UL,_HawkTracer::client::TracepointMap_*,_false>.
                            _M_head_impl + 1;
              UNLOCK();
            }
            else {
              puVar2 = &(((CallgrindConverter *)
                         local_290.
                         super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->super_Converter)._tracepoint_map;
              *(int *)&(puVar2->_M_t).
                       super___uniq_ptr_impl<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HawkTracer::client::TracepointMap_*,_std::default_delete<HawkTracer::client::TracepointMap>_>
                       .super__Head_base<0UL,_HawkTracer::client::TracepointMap_*,_false>.
                       _M_head_impl =
                   *(int *)&(puVar2->_M_t).
                            super___uniq_ptr_impl<HawkTracer::client::TracepointMap,_std::default_delete<HawkTracer::client::TracepointMap>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HawkTracer::client::TracepointMap_*,_std::default_delete<HawkTracer::client::TracepointMap>_>
                            .super__Head_base<0UL,_HawkTracer::client::TracepointMap_*,_false>.
                            _M_head_impl + 1;
            }
          }
          _print_function((CallgrindConverter *)this_00._M_pi,(ofstream *)local_230,&local_290);
          this_00._M_pi =
               local_290.
               super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if ((CallgrindConverter *)
              local_290.
              super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (CallgrindConverter *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_290.
                       super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
      }
      std::ofstream::close();
      local_230 = (undefined1  [8])local_278;
      *(undefined8 *)(local_230 + (long)local_278[-3]) = local_280;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      if (local_2d8 != (char *)&local_2c8) {
        operator_delete(local_2d8);
      }
      std::
      vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
      ::~vector(&local_270);
      if (local_258._current_call.
          super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_258._current_call.
                   super___shared_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::
      vector<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
      ::~vector(&local_258._root_calls);
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void CallgrindConverter::stop()
{
    for (auto& thread : _events)
    {
        CallGraph _call_graph;
        auto root_calls = _call_graph.make(thread.second);

        std::string thread_file_name = _file_name + "." + std::to_string(thread.first);
        std::ofstream thread_output_file(thread_file_name);
        if (thread_output_file.is_open())
        {
            thread_output_file << _callgrind_header << std::endl;
            thread_output_file << "thread: " << thread.first << "\n\n";
            thread_output_file << "events: Duration" << "\n";
            for (auto& root : root_calls)
            {
                _print_function(thread_output_file, root.first);
            }
        }
        else
        {
            std::cerr << "Can't open file: " << thread_file_name << std::endl;
        }
        thread_output_file.close();
    }
}